

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Socket.cpp
# Opt level: O2

void __thiscall Socket::getBufferSizes(Socket *this,int *sendBuffer,int *receiveBuffer)

{
  int iVar1;
  
  iVar1 = getSockOpt(this,7);
  *sendBuffer = iVar1;
  iVar1 = getSockOpt(this,8);
  *receiveBuffer = iVar1;
  return;
}

Assistant:

void Socket::getBufferSizes(int & sendBuffer, int & receiveBuffer) {
  sendBuffer = getSockOpt(SO_SNDBUF);
  receiveBuffer = getSockOpt(SO_RCVBUF);
}